

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

float Gia_ManPatGetQuo(Gia_Man_t *p,Vec_Int_t *vRareCounts,Vec_Wrd_t *vSims,int n,int nWords)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  
  if (vSims->nSize != p->nObjs) {
    __assert_fail("Vec_WrdSize(vSims) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x74c,"float Gia_ManPatGetQuo(Gia_Man_t *, Vec_Int_t *, Vec_Wrd_t *, int, int)");
  }
  fVar4 = 0.0;
  if (1 < vRareCounts->nSize) {
    lVar3 = 1;
    do {
      uVar1 = vRareCounts->pArray[lVar3 + -1];
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar2 = (uVar1 >> 1) * nWords;
      if (((int)uVar2 < 0) || (vSims->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if (((uVar1 ^ (uint)(vSims->pArray[(ulong)uVar2 + (long)(n >> 6)] >> ((byte)n & 0x3f))) & 1)
          == 0) {
        fVar4 = fVar4 + 1.0 / (float)(vRareCounts->pArray[lVar3] + 1);
      }
      lVar3 = lVar3 + 2;
    } while ((int)lVar3 < vRareCounts->nSize);
  }
  return fVar4;
}

Assistant:

float Gia_ManPatGetQuo( Gia_Man_t * p, Vec_Int_t * vRareCounts, Vec_Wrd_t * vSims, int n, int nWords )
{
    float Quality = 0;
    int RareLit, RareCount, i; 
    assert( Vec_WrdSize(vSims) == Gia_ManObjNum(p) );
    Vec_IntForEachEntryDouble( vRareCounts, RareLit, RareCount, i )
    {
        float Incrm = (float)1.0/(RareCount+1);
        int RareObj = Abc_Lit2Var(RareLit);
        int RareVal = Abc_LitIsCompl(RareLit);
        word * pSim = Vec_WrdEntryP( vSims, RareObj*nWords );
        if ( Abc_TtGetBit(pSim, n) == RareVal )
            Quality += Incrm;
    }
    return Quality;
}